

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O1

bool __thiscall
Omega_h::CmdLineItem::parse(CmdLineItem *this,int *p_argc,char **argv,int i,bool should_print)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  
  if (this->parsed_ == true) {
    if (should_print) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"argument <",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->name_)._M_dataplus._M_p,
                          (this->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," being parsed twice!\n",0x15);
    }
    cVar1 = '\0';
  }
  else {
    iVar2 = (*this->_vptr_CmdLineItem[2])(this);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      this->parsed_ = true;
    }
  }
  return (bool)cVar1;
}

Assistant:

bool CmdLineItem::parse(int* p_argc, char** argv, int i, bool should_print) {
  if (parsed_) {
    if (should_print) {
      std::cout << "argument <" << name() << " being parsed twice!\n";
    }
    return false;
  }
  auto ok = parse_impl(p_argc, argv, i, should_print);
  if (ok) parsed_ = true;
  return ok;
}